

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O2

int color_from_gradient(gradient_t *gradient,float pos,pixel_color_t *color)

{
  int iVar1;
  gradient_color_t *left;
  gradient_color_t *right;
  long lVar2;
  
  iVar1 = gradient->num_colors;
  lVar2 = 1;
  left = gradient->colors;
  do {
    right = left + 1;
    if (iVar1 <= lVar2) {
LAB_001016c4:
      return -(uint)(iVar1 <= lVar2);
    }
    if ((left->pos <= pos) && (pos <= right->pos)) {
      color_from_gradient_range(left,right,pos,color);
      goto LAB_001016c4;
    }
    lVar2 = lVar2 + 1;
    left = right;
  } while( true );
}

Assistant:

int color_from_gradient(const gradient_t *gradient, float pos, pixel_color_t *color)
{
    gradient_color_t *left = &gradient->colors[0];

    for (int i = 1; i < gradient->num_colors; ++i) {
        gradient_color_t *right = &gradient->colors[i];

        if (pos >= left->pos && pos <= right->pos) {
            color_from_gradient_range(left, right, pos, color);
            return 0;
        }

        left = right;
    }

    return -1;
}